

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

Number * __thiscall LiteScript::Number::operator-=(Number *this,Number *number)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  
  if (this->numeric_type == '\0' && number->numeric_type == '\0') {
    (this->value).integer = (this->value).integer - (number->value).integer;
  }
  else {
    fVar2 = (this->value).flotting;
    if (this->numeric_type == '\0') {
      fVar2 = (float)(int)fVar2;
    }
    fVar3 = (number->value).flotting;
    if (number->numeric_type == '\0') {
      fVar3 = (float)(int)fVar3;
    }
    fVar2 = fVar2 - fVar3;
    fVar3 = roundf(fVar2);
    bVar1 = fVar3 != fVar2;
    if ((!bVar1) && (!NAN(fVar3) && !NAN(fVar2))) {
      fVar2 = (float)(int)fVar2;
    }
    this->numeric_type = bVar1;
    (this->value).flotting = fVar2;
  }
  return this;
}

Assistant:

LiteScript::Number& LiteScript::Number::operator-=(const LiteScript::Number& number) {
    if (this->numeric_type == 0 && number.numeric_type == 0)
        this->value.integer -= number.value.integer;
    else
        *this = (float)*this - (float)number;
    return *this;
}